

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O3

void DThinker::RunThinkers(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  timespec ts;
  timespec local_30;
  
  ThinkCycles.Sec = 0.0;
  BotSupportCycles.Sec = 0.0;
  ActionCycles.Sec = 0.0;
  BotWTG = 0;
  clock_gettime(1,&local_30);
  ThinkCycles.Sec = ThinkCycles.Sec - ((double)local_30.tv_nsec * 1e-09 + (double)local_30.tv_sec);
  lVar3 = 0x100;
  do {
    TickThinkers((FThinkerList *)((long)&Thinkers[0].Sentinel + lVar3),(FThinkerList *)0x0);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x400);
  iVar2 = 0;
  lVar3 = 0x20;
  do {
    do {
      iVar1 = TickThinkers(FreshThinkers + lVar3,Thinkers + lVar3);
      iVar2 = iVar2 + iVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x80);
    lVar3 = 0x20;
    bVar4 = iVar2 != 0;
    iVar2 = 0;
  } while (bVar4);
  clock_gettime(1,&local_30);
  ThinkCycles.Sec = (double)local_30.tv_nsec * 1e-09 + (double)local_30.tv_sec + ThinkCycles.Sec;
  return;
}

Assistant:

void DThinker::RunThinkers ()
{
	int i, count;

	ThinkCycles.Reset();
	BotSupportCycles.Reset();
	ActionCycles.Reset();
	BotWTG = 0;

	ThinkCycles.Clock();

	// Tick every thinker left from last time
	for (i = STAT_FIRST_THINKING; i <= MAX_STATNUM; ++i)
	{
		TickThinkers (&Thinkers[i], NULL);
	}

	// Keep ticking the fresh thinkers until there are no new ones.
	do
	{
		count = 0;
		for (i = STAT_FIRST_THINKING; i <= MAX_STATNUM; ++i)
		{
			count += TickThinkers (&FreshThinkers[i], &Thinkers[i]);
		}
	} while (count != 0);

	ThinkCycles.Unclock();
}